

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O0

void __thiscall curlpp::Multi::fdset(Multi *this,fd_set *read,fd_set *write,fd_set *exc,int *max)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  RuntimeError *unaff_retaddr;
  CURLMcode code;
  
  iVar1 = curl_multi_fdset(*(undefined8 *)in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  if ((iVar1 != -1) && (iVar1 != 0)) {
    uVar2 = __cxa_allocate_exception(0x10);
    curl_multi_strerror(iVar1);
    RuntimeError::RuntimeError(unaff_retaddr,in_RDI);
    __cxa_throw(uVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  return;
}

Assistant:

void
curlpp::Multi::fdset(fd_set * read, fd_set * write, fd_set * exc, int * max)
{
  CURLMcode code = curl_multi_fdset(mMultiHandle, read, write, exc, max);
  if(code != CURLM_CALL_MULTI_PERFORM) {
    if(code != CURLM_OK) {
      throw curlpp::RuntimeError(curl_multi_strerror(code));
    }
  }
}